

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::BenchmarkImp::UseManualTime(BenchmarkImp *this)

{
  bool bVar1;
  CheckHandler local_20;
  
  bVar1 = this->use_real_time_;
  if (bVar1 == false) {
    local_20.log_ = GetNullLogInstance();
  }
  else {
    CheckHandler::CheckHandler
              (&local_20,"!use_real_time_",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"UseManualTime",0x25b);
  }
  std::operator<<(local_20.log_,"Cannot set UseRealTime and UseManualTime simultaneously.");
  if (bVar1 == false) {
    this->use_manual_time_ = true;
    return;
  }
  CheckHandler::~CheckHandler(&local_20);
}

Assistant:

void BenchmarkImp::UseManualTime() {
  CHECK(!use_real_time_) << "Cannot set UseRealTime and UseManualTime simultaneously.";
  use_manual_time_ = true;
}